

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlReadDoc(xmlChar *cur,char *URL,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt_00;
  htmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlChar *cur_local;
  
  if (cur == (xmlChar *)0x0) {
    cur_local = (xmlChar *)0x0;
  }
  else {
    xmlInitParser();
    ctxt_00 = htmlCreateDocParserCtxt(cur,(char *)0x0);
    if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
      cur_local = (xmlChar *)0x0;
    }
    else {
      cur_local = (xmlChar *)htmlDoRead(ctxt_00,URL,encoding,options,0);
    }
  }
  return (htmlDocPtr)cur_local;
}

Assistant:

htmlDocPtr
htmlReadDoc(const xmlChar * cur, const char *URL, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;

    if (cur == NULL)
        return (NULL);

    xmlInitParser();
    ctxt = htmlCreateDocParserCtxt(cur, NULL);
    if (ctxt == NULL)
        return (NULL);
    return (htmlDoRead(ctxt, URL, encoding, options, 0));
}